

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  rc_data *prVar4;
  _Head_base<0UL,_int_*,_false> _Var5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM4_Qb;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (begin == end) {
    lVar7 = 0;
  }
  else {
    lVar6 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      piVar3 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        dVar8 = 0.0;
      }
      else {
        auVar12._8_8_ = 0x7fffffffffffffff;
        auVar12._0_8_ = 0x7fffffffffffffff;
        auVar9 = ZEXT816(0);
        _Var5._M_head_impl = local_38._M_head_impl;
        do {
          iVar2 = *_Var5._M_head_impl;
          piVar1 = _Var5._M_head_impl + 4;
          _Var5._M_head_impl = _Var5._M_head_impl + 8;
          auVar10._0_8_ = (double)piVar3[iVar2];
          auVar10._8_8_ = in_XMM4_Qb;
          auVar10 = vandpd_avx(auVar10,auVar12);
          auVar11._8_8_ = 0;
          auVar11._0_8_ =
               (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl[*piVar1] +
               (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl[iVar2];
          auVar9 = vfmadd231sd_fma(auVar9,auVar10,auVar11);
          dVar8 = auVar9._0_8_;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)_Var5._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      prVar4 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      prVar4[lVar6].id = (int)lVar6;
      lVar7 = lVar6 + 1;
      prVar4[lVar6].f = piVar3[begin->value];
      piVar3 = &begin->column;
      begin = begin + 1;
      prVar4[lVar6].value =
           (this->c->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl[*piVar3] - dVar8;
      lVar6 = lVar7;
    } while (begin != end);
  }
  return (int)lVar7;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        // to_log(
        //  debug_os, "  compute-reduced-cost {}\n", std::distance(begin,
        //  end));

        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi_p = 0;

            for (auto [first, last] = ap.column(begin->column); first != last;
                 ++first) {
                auto a = std::abs(static_cast<Float>(A[first->value]));
                sum_a_pi_p += a * (pi[first->row] + P[first->value]);
            }

            R[r_size].id = r_size;
            R[r_size].f = A[begin->value];
            R[r_size].value = c(begin->column, x) - sum_a_pi_p;

            // to_log(debug_os,
            //       4u,
            //       "Compute: {} = {} - {} - {}\n",
            //       r_size,
            //       c(begin->column, x),
            //       sum_pi,
            //       sum_p);

            // to_log(debug_os, 4u, "{}x{}\n", R[r_size].f, R[r_size].value);

            ++r_size;
        }

        // to_log(debug_os, "\n");

        return r_size;
    }